

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O0

void __thiscall
booster::callback<int_()>::callback<call_counter>(callback<int_()> *this,call_counter func)

{
  void *pvVar1;
  callable_impl<int,_call_counter> *in_RDI;
  callable<int_()> *in_stack_ffffffffffffffd8;
  intrusive_ptr<booster::callable<int_()>_> *in_stack_ffffffffffffffe0;
  
  pvVar1 = operator_new(0x18);
  callable_impl<int,_call_counter>::callable_impl(in_RDI,(call_counter)(int)((ulong)pvVar1 >> 0x20))
  ;
  intrusive_ptr<booster::callable<int_()>_>::intrusive_ptr
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,SUB81((ulong)pvVar1 >> 0x38,0));
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}